

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

timestamp_t __thiscall AnalogConsumer::getData(AnalogConsumer *this,int16_t *dest)

{
  int16_t iVar1;
  pointer puVar2;
  uint *puVar3;
  pointer piVar4;
  pointer psVar5;
  int iVar6;
  undefined4 extraout_var;
  ulong uVar7;
  int64_t iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  timestamp_t tVar12;
  
  puVar2 = (this->temp_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar6 = (*(this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub[5])
                    (this,puVar2,
                     (long)(this->temp_buffer).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar2);
  if (CONCAT44(extraout_var,iVar6) == 0) {
    uVar7 = 0;
    iVar8 = 0;
  }
  else {
    puVar3 = (uint *)(this->temp_buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    piVar4 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar4;
    if (lVar9 != 0) {
      uVar10 = lVar9 >> 2;
      puVar2 = (this->il_id_masks).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar5 = (this->prev_interleaved).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = this->il_byte_loc;
      uVar7 = 2;
      if (2 < uVar10) {
        uVar7 = uVar10;
      }
      lVar9 = 0;
      iVar11 = 0;
      do {
        if (piVar4[lVar9 * 2 + 1] == -1) {
          dest[lVar9] = *(int16_t *)((long)puVar3 + (long)piVar4[lVar9 * 2] + 4);
        }
        else {
          if ((puVar2[iVar11] & *(byte *)((long)puVar3 + (long)iVar6 + 4)) == 0) {
            dest[lVar9] = psVar5[iVar11];
          }
          else {
            iVar1 = *(int16_t *)((long)puVar3 + (long)piVar4[lVar9 * 2] + 4);
            dest[lVar9] = iVar1;
            psVar5[iVar11] = iVar1;
          }
          iVar11 = iVar11 + 1;
        }
        lVar9 = lVar9 + 1;
      } while ((uVar7 - 1 >> 1) + 1 != lVar9);
    }
    uVar7 = (ulong)*puVar3;
    iVar8 = (this->super_HFSubConsumer).lasttimestamp;
  }
  tVar12.system_timestamp = iVar8;
  tVar12._0_8_ = uVar7;
  return tVar12;
}

Assistant:

timestamp_t AnalogConsumer::getData(int16_t *dest){
    if(!readData(temp_buffer.data(), temp_buffer.size())){
        return {0,0};
    }
    byte *src = (byte*)temp_buffer.data() + sizeof(uint32_t);
    int offset = 0;
    int il_i = 0;
    for(size_t i = 0; i < args.indices.size(); i += 2){
        int byt = args.indices[i];
        int bit = args.indices[i+1];
        if(bit == -1){
            //Non interleaved
            dest[offset] = *(int16_t*)(src+byt);
        }
        else{
            //Interleaved
            //Compare mask[il_i] and packet's il id byte
            if(il_id_masks[il_i] & src[il_byte_loc]){
                //If packet contains this type of data
                dest[offset] = *(int16_t*)(src+byt);
                prev_interleaved[il_i] = dest[offset];
            }
            else{
                //Else, use prev il data
                dest[offset] = prev_interleaved[il_i];
            }
            il_i++;
        }
        offset++;
    }
    return {*(uint32_t*)(temp_buffer.data()), lastSysTimestamp()}; //Timestamp at beginning of packet
}